

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::CreateTexture_3DGS_MDL5
          (MDLImporter *this,uchar *szData,uint iType,uint *piSkip)

{
  undefined1 auVar1 [16];
  aiTexture *this_00;
  uchar *szData_00;
  aiTexel *paVar2;
  aiTexture **ppaVar3;
  ulong uVar4;
  aiTexture **ppaVar5;
  bool bVar6;
  uint local_44;
  uint i;
  aiTexture **pc;
  aiTexture *pcNew;
  bool bNoRead;
  uint *piSkip_local;
  uint iType_local;
  uchar *szData_local;
  MDLImporter *this_local;
  
  if (piSkip == (uint *)0x0) {
    __assert_fail("__null != piSkip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x197,
                  "void Assimp::MDLImporter::CreateTexture_3DGS_MDL5(const unsigned char *, unsigned int, unsigned int *)"
                 );
  }
  bVar6 = *piSkip == 0xffffffff;
  this_00 = (aiTexture *)operator_new(0x428);
  aiTexture::aiTexture(this_00);
  SizeCheck(this,szData + 8,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x19d);
  this_00->mWidth = *(uint *)szData;
  this_00->mHeight = *(uint *)(szData + 4);
  szData_00 = szData + 8;
  if (bVar6) {
    this_00->pcData = (aiTexel *)0xffffffffffffffff;
  }
  if (iType == 6) {
    *piSkip = this_00->mWidth;
    SizeCheck(this,szData_00 + *piSkip,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x1b4);
    if (!bVar6) {
      this_00->mHeight = 0;
      builtin_strncpy(this_00->achFormatHint,"dds",4);
      paVar2 = (aiTexel *)operator_new__((ulong)this_00->mWidth);
      this_00->pcData = paVar2;
      memcpy(this_00->pcData,szData_00,(ulong)this_00->mWidth);
    }
  }
  else {
    ParseTextureColorData(this,szData_00,iType,piSkip,this_00);
  }
  *piSkip = *piSkip + 8;
  if (bVar6) {
    this_00->pcData = (aiTexel *)0x0;
    if (this_00 != (aiTexture *)0x0) {
      aiTexture::~aiTexture(this_00);
      operator_delete(this_00,0x428);
    }
  }
  else if (this->pScene->mNumTextures == 0) {
    this->pScene->mNumTextures = 1;
    ppaVar3 = (aiTexture **)operator_new__(8);
    this->pScene->mTextures = ppaVar3;
    *this->pScene->mTextures = this_00;
  }
  else {
    ppaVar3 = this->pScene->mTextures;
    auVar1 = ZEXT416(this->pScene->mNumTextures + 1) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiTexture **)operator_new__(uVar4);
    this->pScene->mTextures = ppaVar5;
    for (local_44 = 0; local_44 < this->pScene->mNumTextures; local_44 = local_44 + 1) {
      this->pScene->mTextures[local_44] = ppaVar3[local_44];
    }
    this->pScene->mTextures[this->pScene->mNumTextures] = this_00;
    this->pScene->mNumTextures = this->pScene->mNumTextures + 1;
    if (ppaVar3 != (aiTexture **)0x0) {
      operator_delete__(ppaVar3);
    }
  }
  return;
}

Assistant:

void MDLImporter::CreateTexture_3DGS_MDL5(const unsigned char* szData,
    unsigned int iType,
    unsigned int* piSkip)
{
    ai_assert(NULL != piSkip);
    bool bNoRead = *piSkip == UINT_MAX;

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();

    VALIDATE_FILE_SIZE(szData+8);

    // first read the size of the texture
    pcNew->mWidth = *((uint32_t*)szData);
    AI_SWAP4(pcNew->mWidth);
    szData += sizeof(uint32_t);

    pcNew->mHeight = *((uint32_t*)szData);
    AI_SWAP4(pcNew->mHeight);
    szData += sizeof(uint32_t);

    if (bNoRead) {
        pcNew->pcData = bad_texel;
    }

    // this should not occur - at least the docs say it shouldn't.
    // however, one can easily try out what MED does if you have
    // a model with a DDS texture and export it to MDL5 ...
    // yeah, it embedds the DDS file.
    if (6 == iType)
    {
        // this is a compressed texture in DDS format
        *piSkip = pcNew->mWidth;
        VALIDATE_FILE_SIZE(szData + *piSkip);

        if (!bNoRead)
        {
            // place a hint and let the application know that this is a DDS file
            pcNew->mHeight = 0;
            pcNew->achFormatHint[0] = 'd';
            pcNew->achFormatHint[1] = 'd';
            pcNew->achFormatHint[2] = 's';
            pcNew->achFormatHint[3] = '\0';

            pcNew->pcData = (aiTexel*) new unsigned char[pcNew->mWidth];
            ::memcpy(pcNew->pcData,szData,pcNew->mWidth);
        }
    }
    else
    {
        // parse the color data of the texture
        ParseTextureColorData(szData,iType,piSkip,pcNew);
    }
    *piSkip += sizeof(uint32_t) * 2;

    if (!bNoRead)
    {
        // store the texture
        if (!this->pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew;
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < pScene->mNumTextures;++i)
                this->pScene->mTextures[i] = pc[i];

            pScene->mTextures[pScene->mNumTextures] = pcNew;
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    else {
        pcNew->pcData = NULL;
        delete pcNew;
    }
    return;
}